

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
::findImpl<axl::sl::PtrIterator<char_const,false>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
           *this,PtrIterator<const_char,_false> *accessor,size_t i0,size_t length)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PtrIterator<const_char,_false> *pPVar6;
  ulong uVar7;
  char cVar8;
  PtrIterator<const_char,_false> *pPVar9;
  PtrIterator<const_char,_false> *pPVar10;
  PtrIterator<const_char,_false> *pPVar11;
  long lVar12;
  bool bVar13;
  
  lVar2 = *(long *)(this + 0x10);
  lVar1 = lVar2 + -1;
  pPVar9 = accessor;
  pPVar11 = (PtrIterator<const_char,_false> *)(lVar2 + -1 + i0);
  do {
    if (length <= pPVar11) {
      return (long)pPVar11 - lVar1;
    }
    cVar8 = accessor->m_p[(long)pPVar11];
    bVar13 = cVar8 == *(char *)(*(long *)this + lVar1);
    lVar12 = lVar1;
    if (bVar13) {
      pPVar6 = (PtrIterator<const_char,_false> *)((long)pPVar11 + (1 - lVar2));
      lVar5 = lVar2 + -2;
      lVar4 = lVar1;
      while (lVar12 = lVar5, pPVar10 = pPVar6, lVar4 != 0) {
        pPVar11 = (PtrIterator<const_char,_false> *)((long)&pPVar11[-1].m_p + 7);
        cVar8 = accessor->m_p[(long)pPVar11];
        bVar13 = cVar8 == *(char *)(*(long *)this + lVar12);
        if (!bVar13) goto LAB_00122043;
        lVar5 = lVar12 + -1;
        lVar4 = lVar12;
      }
    }
    else {
LAB_00122043:
      uVar3 = *(ulong *)(*(long *)(this + 0x18) + ((ulong)(long)cVar8 % *(ulong *)(this + 0x28)) * 8
                        );
      uVar7 = *(ulong *)(*(long *)(this + 0x30) + lVar12 * 8);
      if (uVar7 < uVar3) {
        uVar7 = uVar3;
      }
      pPVar6 = (PtrIterator<const_char,_false> *)((long)&pPVar11->m_p + uVar7);
      pPVar10 = pPVar9;
    }
    pPVar9 = pPVar10;
    pPVar11 = pPVar6;
    if (bVar13) {
      return (size_t)pPVar10;
    }
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}